

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitBreak(FunctionValidator *this,Break *curr)

{
  noteBreak(this,(Name)(curr->name).super_IString.str,curr->value,(Expression *)curr);
  if (curr->value != (Expression *)0x0) {
    shouldBeTrue<wasm::Break*>
              (this,(curr->value->type).id != 0,curr,"break value must not have none type");
  }
  if (curr->condition != (Expression *)0x0) {
    shouldBeTrue<wasm::Break*>
              (this,(curr->condition->type).id - 1 < 2,curr,"break condition must be i32");
    return;
  }
  return;
}

Assistant:

void FunctionValidator::visitBreak(Break* curr) {
  noteBreak(curr->name, curr->value, curr);
  if (curr->value) {
    shouldBeTrue(curr->value->type != Type::none,
                 curr,
                 "break value must not have none type");
  }
  if (curr->condition) {
    shouldBeTrue(curr->condition->type == Type::unreachable ||
                   curr->condition->type == Type::i32,
                 curr,
                 "break condition must be i32");
  }
}